

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O2

CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
          (CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this,Scalar *s)

{
  Scalar SVar1;
  uint __line;
  long lVar2;
  char *__assertion;
  
  lVar2 = this->m_col;
  if (lVar2 == 3) {
    lVar2 = this->m_row + this->m_currentBlockRows;
    this->m_row = lVar2;
    this->m_col = 0;
    this->m_currentBlockRows = 1;
    if (lVar2 < 3) {
      lVar2 = 0;
LAB_00144a51:
      SVar1 = *s;
      this->m_col = lVar2 + 1;
      (this->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
      array[lVar2 * 3 + this->m_row] = SVar1;
      return this;
    }
    __assertion = "m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
    ;
    __line = 0x49;
  }
  else if (lVar2 < 3) {
    if (this->m_currentBlockRows == 1) goto LAB_00144a51;
    __assertion = "m_currentBlockRows==1";
    __line = 0x4d;
  }
  else {
    __assertion = 
    "m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\"";
    __line = 0x4c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                ,__line,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, 3, 3>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }